

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<unsigned_char>_>::flattenTo
          (Delimited<kj::ArrayPtr<unsigned_char>_> *this,char *target)

{
  bool bVar1;
  CappedArray<char,_5UL> *pCVar2;
  CappedArray<char,_5UL> *elem;
  CappedArray<char,_5UL> *__end0;
  CappedArray<char,_5UL> *__begin0;
  Array<kj::CappedArray<char,_5UL>_> *__range3;
  char *pcStack_18;
  bool first;
  char *target_local;
  Delimited<kj::ArrayPtr<unsigned_char>_> *this_local;
  
  ensureStringifiedInitialized(this);
  bVar1 = true;
  __end0 = Array<kj::CappedArray<char,_5UL>_>::begin(&this->stringified);
  pCVar2 = Array<kj::CappedArray<char,_5UL>_>::end(&this->stringified);
  pcStack_18 = target;
  for (; __end0 != pCVar2; __end0 = __end0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pcStack_18 = fill<kj::StringPtr>(pcStack_18,&this->delimiter);
    }
    pcStack_18 = fill<kj::CappedArray<char,5ul>>(pcStack_18,__end0);
  }
  return pcStack_18;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }